

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_gfx_enable_texture(uint id)

{
  uint uVar1;
  rf_render_batch *prVar2;
  long lVar3;
  rf_draw_call *prVar4;
  long lVar5;
  rf_vertex_buffer *prVar6;
  uint uVar7;
  
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->draw_calls_counter;
  prVar4 = prVar2->draw_calls;
  if (prVar4[lVar3 + -1].texture_id != id) {
    uVar1 = prVar4[lVar3 + -1].vertex_count;
    if (0 < (int)uVar1) {
      if (prVar4[lVar3 + -1].mode == RF_TRIANGLES) {
        uVar7 = 1;
        if (3 < (int)uVar1) {
          uVar7 = 4 - (uVar1 & 3);
        }
      }
      else {
        uVar7 = 0;
        if ((prVar4[lVar3 + -1].mode == RF_LINES) && (uVar7 = uVar1 & 3, (int)uVar1 < 4)) {
          uVar7 = uVar1;
        }
      }
      prVar4[lVar3 + -1].vertex_alignment = uVar7;
      lVar5 = prVar2->current_buffer;
      prVar6 = prVar2->vertex_buffers;
      if ((int)(prVar6[lVar5].v_counter + uVar7) < prVar6[lVar5].elements_count * 4) {
        prVar6[lVar5].v_counter = prVar6[lVar5].v_counter + uVar7;
        prVar6[lVar5].c_counter = prVar6[lVar5].c_counter + uVar7;
        prVar6[lVar5].tc_counter = prVar6[lVar5].tc_counter + uVar7;
        prVar2->draw_calls_counter = lVar3 + 1;
      }
      else {
        rf_gfx_draw();
      }
    }
    if (0xff < ((rf__ctx->field_0).current_batch)->draw_calls_counter) {
      rf_gfx_draw();
    }
    prVar2 = (rf__ctx->field_0).current_batch;
    lVar3 = prVar2->draw_calls_counter;
    prVar4 = prVar2->draw_calls;
    prVar4[lVar3 + -1].texture_id = id;
    prVar4[lVar3 + -1].vertex_count = 0;
  }
  return;
}

Assistant:

RF_API void rf_gfx_enable_texture(unsigned int id)
{
    if (rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].texture_id != id)
    {
        if (rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count > 0)
        {
            // Make sure current rf_ctx->gl_ctx.draws[i].vertex_count is aligned a multiple of 4,
            // that way, following QUADS drawing will keep aligned with index processing
            // It implies adding some extra alignment vertex at the end of the draw,
            // those vertex are not processed but they are considered as an additional offset
            // for the next set of vertex to be drawn
            if (rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].mode == RF_LINES)
            {
                rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment = ((rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count < 4) ? rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count : rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count % 4);
            }
            else if (rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].mode == RF_TRIANGLES)
            {
                rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment = ((rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count < 4) ? 1 : (4 - (rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count % 4)));
            }
            else
            {
                rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment = 0;
            }

            if (rf_gfx_check_buffer_limit(rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment))
            {
                rf_gfx_draw();
            }
            else
            {
                rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter += rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment;
                rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter += rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment;
                rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter += rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment;

                rf_batch.draw_calls_counter++;
            }
        }

        if (rf_batch.draw_calls_counter >= RF_DEFAULT_BATCH_DRAW_CALLS_COUNT)
        {
            rf_gfx_draw();
        }

        rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].texture_id = id;
        rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count = 0;
    }
}